

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall soplex::SPxScaler<double>::minAbsRowscale(SPxScaler<double> *this)

{
  DataArray<int> *this_00;
  int iVar1;
  int *piVar2;
  long in_RDI;
  Real RVar3;
  int i;
  int mini;
  DataArray<int> *rowscaleExp;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 local_18;
  undefined4 local_14;
  
  this_00 = *(DataArray<int> **)(in_RDI + 0x18);
  local_14 = std::numeric_limits<int>::max();
  local_18 = 0;
  while( true ) {
    iVar4 = local_18;
    iVar1 = DataArray<int>::size(this_00);
    if (iVar1 <= iVar4) break;
    piVar2 = DataArray<int>::operator[](this_00,local_18);
    if (*piVar2 < local_14) {
      piVar2 = DataArray<int>::operator[](this_00,local_18);
      local_14 = *piVar2;
    }
    local_18 = local_18 + 1;
  }
  RVar3 = spxLdexp((Real)CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  return RVar3;
}

Assistant:

R SPxScaler<R>::minAbsRowscale() const
{
   const DataArray < int >& rowscaleExp = *m_activeRowscaleExp;

   int mini = std::numeric_limits<int>::max();

   for(int i = 0; i < rowscaleExp.size(); ++i)
      if(rowscaleExp[i] < mini)
         mini = rowscaleExp[i];

   return spxLdexp(1.0, mini);
}